

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.cpp
# Opt level: O0

void __thiscall qclab::io::QASMFile::parse(QASMFile *this)

{
  reference pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  string *delimiter;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  string local_168;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  reference local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_e0;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined8 local_70;
  char *local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50 [3];
  string local_38 [8];
  string str;
  bool hasQreg;
  QASMFile *this_local;
  
  str.field_2._M_local_buf[0xf] = '\0';
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string(local_38);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)this,local_38);
    local_60._M_current = (char *)std::__cxx11::string::begin();
    local_68 = (char *)std::__cxx11::string::end();
    local_58 = std::
               remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                         (local_60,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_68,isspace);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_50,&local_58);
    local_78._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_70,&local_78);
    std::__cxx11::string::erase(local_38,local_50[0],local_70);
    lVar5 = std::__cxx11::string::length();
    if (lVar5 != 0) {
      delimiter = (string *)0x2;
      std::__cxx11::string::substr
                ((ulong)&commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_38);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &commands.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"//");
      std::__cxx11::string::~string
                ((string *)
                 &commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,";",(allocator<char> *)((long)&__range3 + 7));
        split<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0,(io *)local_38,&local_e0,delimiter);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_c0);
        command = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c0);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&command), bVar3) {
          local_108 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          if ((str.field_2._M_local_buf[0xf] & 1U) == 0) {
            std::__cxx11::string::substr((ulong)&local_128,(ulong)local_108);
            bVar3 = std::operator==(&local_128,"qreg");
            std::__cxx11::string::~string((string *)&local_128);
            if (bVar3) {
              std::__cxx11::string::substr((ulong)local_148,(ulong)local_108);
              std::__cxx11::string::operator=((string *)local_108,local_148);
              std::__cxx11::string::~string(local_148);
              pbVar1 = local_108;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_188,"[",&local_189);
              left_of(&local_168,pbVar1,&local_188);
              std::__cxx11::string::operator=((string *)&this->qregName_,(string *)&local_168);
              std::__cxx11::string::~string((string *)&local_168);
              std::__cxx11::string::~string((string *)&local_188);
              std::allocator<char>::~allocator(&local_189);
              pbVar1 = local_108;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d0,"]",&local_1d1);
              left_of(&local_1b0,pbVar1,&local_1d0);
              iVar4 = read_value<int>(&local_1b0);
              this->nbQubits_ = iVar4;
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_1d0);
              std::allocator<char>::~allocator(&local_1d1);
              str.field_2._M_local_buf[0xf] = '\x01';
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->gateCommands_,local_108);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
      }
    }
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void QASMFile::parse() {

    bool hasQreg = false ;

    // loop over lines in file
    while ( not stream_.eof() ) {

      // new line + remove all whitespaces
      std::string str ;
      std::getline( stream_ , str ) ;
      str.erase( remove_if( str.begin() , str.end() , isspace ) , str.end() ) ;

      // skip blank and comment lines
      if ( str.length() < 1 ) { continue ; }
      if ( str.substr( 0 , 2 ) == "//" ) { continue ; }

      // split commands on this line
      auto commands = split< std::string >( str , ";" ) ;

      // parse commands
      for ( auto& command : commands ) {
        if ( !hasQreg ) {
          if ( command.substr( 0 , 4 ) == "qreg" ) {
            // set quantum register
            command = command.substr( 4 ) ;
            qregName_ = left_of( command , "[" ) ;
            nbQubits_ = read_value< int >( left_of( command , "]" ) ) ;
            hasQreg = true ;
          }
        } else {
          // read gates
          gateCommands_.push_back( command ) ;
        }
      }

    }

  }